

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O1

void amrex::FArrayBox::Initialize(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  undefined **ppuVar5;
  undefined4 extraout_var_00;
  undefined8 *puVar6;
  RealDescriptor *pRVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int __flags;
  uint __flags_00;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  __fn *__fn;
  char *pcVar8;
  void *in_R8;
  string fmt;
  string ord;
  ParmParse pp;
  string local_b8;
  string local_98;
  ParmParse local_78;
  undefined4 extraout_var;
  
  if (initialized != '\0') {
    return;
  }
  initialized = 1;
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"fab","");
  ParmParse::ParmParse(&local_78,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  __fn = (__fn *)0x7834b3;
  __flags = 0;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  iVar2 = ParmParse::query(&local_78,"format",&local_b8,0);
  if (iVar2 == 0) {
    format = 2;
    puVar6 = (undefined8 *)operator_new(0x10);
    pRVar7 = FPC::NativeRealDescriptor();
    iVar2 = RealDescriptor::clone(pRVar7,__fn,__child_stack,__flags,in_R8);
    uVar4 = CONCAT44(extraout_var,iVar2);
LAB_0056eef5:
    *puVar6 = &PTR__FABio_binary_00838e10;
    puVar6[1] = uVar4;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_b8);
    if (iVar2 == 0) {
      format = 0;
      puVar6 = (undefined8 *)operator_new(8);
      ppuVar5 = &PTR__FABio_00838e58;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_b8);
      if (iVar2 != 0) {
        pcVar8 = "NATIVE";
        iVar2 = std::__cxx11::string::compare((char *)&local_b8);
        if (iVar2 == 0) {
          format = 2;
          puVar6 = (undefined8 *)operator_new(0x10);
          pRVar7 = FPC::NativeRealDescriptor();
          iVar2 = RealDescriptor::clone(pRVar7,(__fn *)pcVar8,__child_stack_00,__flags,in_R8);
          uVar4 = CONCAT44(extraout_var_00,iVar2);
        }
        else {
          pcVar8 = "NATIVE_32";
          iVar2 = std::__cxx11::string::compare((char *)&local_b8);
          if (iVar2 == 0) {
            format = 6;
            puVar6 = (undefined8 *)operator_new(0x10);
            pRVar7 = FPC::Native32RealDescriptor();
            iVar2 = RealDescriptor::clone(pRVar7,(__fn *)pcVar8,__child_stack_02,__flags,in_R8);
            uVar4 = CONCAT44(extraout_var_02,iVar2);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_b8);
            if ((iVar2 != 0) &&
               (iVar2 = std::__cxx11::string::compare((char *)&local_b8), iVar2 != 0)) {
              poVar3 = ErrorStream();
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,"FArrayBox::init(): Bad FABio::Format = ",0x27);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,local_b8._M_dataplus._M_p,local_b8._M_string_length);
              puVar6 = (undefined8 *)0x0;
              Abort_host((char *)0x0);
              goto LAB_0056ef46;
            }
            pcVar8 = "IEEE";
            iVar2 = std::__cxx11::string::compare((char *)&local_b8);
            __flags_00 = (uint)(iVar2 != 0);
            format = __flags_00 * 4 + 1;
            puVar6 = (undefined8 *)operator_new(0x10);
            pRVar7 = FPC::Ieee32NormalRealDescriptor();
            iVar2 = RealDescriptor::clone(pRVar7,(__fn *)pcVar8,__child_stack_01,__flags_00,in_R8);
            uVar4 = CONCAT44(extraout_var_01,iVar2);
          }
        }
        goto LAB_0056eef5;
      }
      format = 4;
      puVar6 = (undefined8 *)operator_new(8);
      ppuVar5 = &PTR__FABio_00838f10;
    }
    *puVar6 = ppuVar5;
  }
LAB_0056ef46:
  if (fabio != (long *)0x0) {
    (**(code **)(*fabio + 8))();
  }
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  fabio = puVar6;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  iVar2 = ParmParse::query(&local_78,"ordering",&local_98,0);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_98);
    if (iVar2 == 0) {
      ordering = 0;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_98);
      if (iVar2 == 0) {
        ordering = 1;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_98);
        if (iVar2 == 0) {
          ordering = 2;
        }
        else {
          poVar3 = ErrorStream();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"FArrayBox::init(): Bad FABio::Ordering = ",0x29);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,local_98._M_dataplus._M_p,local_98._M_string_length);
          Abort_host((char *)0x0);
        }
      }
    }
  }
  initval = 0x7ff8000000000000;
  ParmParse::queryAdd<double,_0>(&local_78,"initval",(double *)&initval);
  ParmParse::queryAdd<bool,_0>(&local_78,"do_initval",(bool *)&do_initval);
  ParmParse::queryAdd<bool,_0>(&local_78,"init_snan",(bool *)&init_snan);
  ExecOnFinalize((PTR_TO_VOID_FUNC)0x56f0b1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_78);
  return;
}

Assistant:

void
FArrayBox::Initialize ()
{
    if (initialized) return;
    initialized = true;

    BL_ASSERT(fabio == 0);

    ParmParse pp("fab");

    std::string fmt;
    //
    // This block can legitimately set FAB output format.
    //
    if (pp.query("format", fmt))
    {
        FABio* fio = 0;

        if (fmt == "ASCII")
        {
            FArrayBox::format = FABio::FAB_ASCII;
            fio = new FABio_ascii;
        }
        else if (fmt == "8BIT")
        {
            FArrayBox::format = FABio::FAB_8BIT;
            fio = new FABio_8bit;
        }
        else if (fmt == "NATIVE")
        {
            FArrayBox::format = FABio::FAB_NATIVE;
            fio = new FABio_binary(FPC::NativeRealDescriptor().clone());
        }
        else if (fmt == "NATIVE_32")
        {
            FArrayBox::format = FABio::FAB_NATIVE_32;
            fio = new FABio_binary(FPC::Native32RealDescriptor().clone());
        }
        else if (fmt == "IEEE" || fmt == "IEEE32")
        {
            if (fmt == "IEEE")
            {
                FArrayBox::format = FABio::FAB_IEEE;
                //amrex::Warning("IEEE fmt in ParmParse files is deprecated");
            }
            else
            {
                FArrayBox::format = FABio::FAB_IEEE_32;
            }
            fio = new FABio_binary(FPC::Ieee32NormalRealDescriptor().clone());
        }
        else
        {
            amrex::ErrorStream() << "FArrayBox::init(): Bad FABio::Format = " << fmt;
            amrex::Abort();
        }

        setFABio(fio);
    }
    else
    {
        //
        // We default to "NATIVE" if nothing is specified.
        //
        FArrayBox::format = FABio::FAB_NATIVE;

        setFABio(new FABio_binary(FPC::NativeRealDescriptor().clone()));
    }
    //
    // This block sets ordering which doesn't affect output format.
    // It is only used when reading in an old FAB.
    //
    std::string ord;

    if (pp.query("ordering", ord))
    {
        if (ord == "NORMAL_ORDER")
            FArrayBox::setOrdering(FABio::FAB_NORMAL_ORDER);
        else if (ord == "REVERSE_ORDER")
            FArrayBox::setOrdering(FABio::FAB_REVERSE_ORDER);
        else if (ord == "REVERSE_ORDER_2")
            FArrayBox::setOrdering(FABio::FAB_REVERSE_ORDER_2);
        else
        {
            amrex::ErrorStream() << "FArrayBox::init(): Bad FABio::Ordering = " << ord;
            amrex::Abort();
        }
    }

    initval = std::numeric_limits<Real>::has_quiet_NaN
            ? std::numeric_limits<Real>::quiet_NaN()
            : std::numeric_limits<Real>::max();

    pp.queryAdd("initval",    initval);
    pp.queryAdd("do_initval", do_initval);
    pp.queryAdd("init_snan", init_snan);

    amrex::ExecOnFinalize(FArrayBox::Finalize);
}